

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt__matchpair(stbtt_uint8 *fc,stbtt_uint32 nm,stbtt_uint8 *name,stbtt_int32 nlen,
                    stbtt_int32 target_id,stbtt_int32 next_id)

{
  stbtt_uint16 sVar1;
  stbtt_uint16 sVar2;
  stbtt_uint16 sVar3;
  stbtt_uint16 sVar4;
  stbtt_uint16 sVar5;
  stbtt_uint16 sVar6;
  stbtt_uint16 sVar7;
  uint uVar8;
  stbtt_int32 sVar9;
  int iVar10;
  stbtt_int32 matchlen;
  stbtt_int32 off;
  stbtt_int32 slen;
  stbtt_int32 language;
  stbtt_int32 encoding;
  stbtt_int32 platform;
  stbtt_int32 id;
  stbtt_uint32 loc;
  stbtt_int32 stringOffset;
  stbtt_int32 count;
  stbtt_int32 i;
  stbtt_int32 next_id_local;
  stbtt_int32 target_id_local;
  stbtt_int32 nlen_local;
  stbtt_uint8 *name_local;
  stbtt_uint32 nm_local;
  stbtt_uint8 *fc_local;
  
  sVar1 = ttUSHORT(fc + (ulong)nm + 2);
  sVar2 = ttUSHORT(fc + (ulong)nm + 4);
  stringOffset = 0;
  do {
    if ((int)(uint)sVar1 <= stringOffset) {
      return 0;
    }
    uVar8 = nm + 6 + stringOffset * 0xc;
    sVar3 = ttUSHORT(fc + (ulong)uVar8 + 6);
    if ((uint)sVar3 == target_id) {
      sVar3 = ttUSHORT(fc + uVar8);
      sVar4 = ttUSHORT(fc + (ulong)uVar8 + 2);
      sVar5 = ttUSHORT(fc + (ulong)uVar8 + 4);
      if (((sVar3 == 0) || ((sVar3 == 3 && (sVar4 == 1)))) || ((sVar3 == 3 && (sVar4 == 10)))) {
        sVar6 = ttUSHORT(fc + (ulong)uVar8 + 8);
        sVar7 = ttUSHORT(fc + (ulong)uVar8 + 10);
        sVar9 = stbtt__CompareUTF8toUTF16_bigendian_prefix
                          (name,nlen,fc + (long)(int)(uint)sVar7 + (long)(int)(nm + sVar2),
                           (uint)sVar6);
        if (-1 < sVar9) {
          if ((((stringOffset + 1 < (int)(uint)sVar1) &&
               (sVar6 = ttUSHORT(fc + (ulong)uVar8 + 0x12), (uint)sVar6 == next_id)) &&
              (sVar6 = ttUSHORT(fc + (ulong)uVar8 + 0xc), sVar6 == sVar3)) &&
             ((sVar3 = ttUSHORT(fc + (ulong)uVar8 + 0xe), sVar3 == sVar4 &&
              (sVar3 = ttUSHORT(fc + (ulong)uVar8 + 0x10), sVar3 == sVar5)))) {
            sVar3 = ttUSHORT(fc + (ulong)uVar8 + 0x14);
            sVar4 = ttUSHORT(fc + (ulong)uVar8 + 0x16);
            if (sVar3 == 0) {
              if (sVar9 == nlen) {
                return 1;
              }
            }
            else if (((sVar9 < nlen) && (name[sVar9] == ' ')) &&
                    (iVar10 = stbtt_CompareUTF8toUTF16_bigendian
                                        ((char *)(name + (sVar9 + 1)),nlen - (sVar9 + 1),
                                         (char *)(fc + (long)(int)(uint)sVar4 +
                                                       (long)(int)(nm + sVar2)),(uint)sVar3),
                    iVar10 != 0)) {
              return 1;
            }
          }
          else if (sVar9 == nlen) {
            return 1;
          }
        }
      }
    }
    stringOffset = stringOffset + 1;
  } while( true );
}

Assistant:

static int stbtt__matchpair(stbtt_uint8 *fc, stbtt_uint32 nm, stbtt_uint8 *name, stbtt_int32 nlen, stbtt_int32 target_id, stbtt_int32 next_id)
{
   stbtt_int32 i;
   stbtt_int32 count = ttUSHORT(fc+nm+2);
   stbtt_int32 stringOffset = nm + ttUSHORT(fc+nm+4);

   for (i=0; i < count; ++i) {
      stbtt_uint32 loc = nm + 6 + 12 * i;
      stbtt_int32 id = ttUSHORT(fc+loc+6);
      if (id == target_id) {
         // find the encoding
         stbtt_int32 platform = ttUSHORT(fc+loc+0), encoding = ttUSHORT(fc+loc+2), language = ttUSHORT(fc+loc+4);

         // is this a Unicode encoding?
         if (platform == 0 || (platform == 3 && encoding == 1) || (platform == 3 && encoding == 10)) {
            stbtt_int32 slen = ttUSHORT(fc+loc+8);
            stbtt_int32 off = ttUSHORT(fc+loc+10);

            // check if there's a prefix match
            stbtt_int32 matchlen = stbtt__CompareUTF8toUTF16_bigendian_prefix(name, nlen, fc+stringOffset+off,slen);
            if (matchlen >= 0) {
               // check for target_id+1 immediately following, with same encoding & language
               if (i+1 < count && ttUSHORT(fc+loc+12+6) == next_id && ttUSHORT(fc+loc+12) == platform && ttUSHORT(fc+loc+12+2) == encoding && ttUSHORT(fc+loc+12+4) == language) {
                  slen = ttUSHORT(fc+loc+12+8);
                  off = ttUSHORT(fc+loc+12+10);
                  if (slen == 0) {
                     if (matchlen == nlen)
                        return 1;
                  } else if (matchlen < nlen && name[matchlen] == ' ') {
                     ++matchlen;
                     if (stbtt_CompareUTF8toUTF16_bigendian((char*) (name+matchlen), nlen-matchlen, (char*)(fc+stringOffset+off),slen))
                        return 1;
                  }
               } else {
                  // if nothing immediately following
                  if (matchlen == nlen)
                     return 1;
               }
            }
         }

         // @TODO handle other encodings
      }
   }
   return 0;
}